

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

void CopyPlayer(player_t *dst,player_t *src,char *name)

{
  userinfo_t *this;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  DBot *pDVar4;
  DPSprite *pDVar5;
  undefined8 *puVar6;
  int iVar7;
  undefined8 *puVar8;
  anon_union_8_2_947301c2_for_TObjPtr<DPSprite>_1 *paVar9;
  DPSprite *pDVar10;
  botinfo_t *pbVar11;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> local_68;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> local_48;
  
  local_48.NumUsed = 0;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::SetNodeVector
            (&local_48,1);
  local_68.NumUsed = 0;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::SetNodeVector
            (&local_68,1);
  local_48._16_8_ = local_48._16_8_ & 0xffffffff;
  M_Free(local_48.Nodes);
  this = &dst->userinfo;
  local_48.Nodes =
       (dst->userinfo).
       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Nodes;
  local_48.LastFree =
       (dst->userinfo).
       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.LastFree;
  local_48.Size =
       (dst->userinfo).
       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size;
  local_48.NumUsed =
       (dst->userinfo).
       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.NumUsed;
  (this->super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>).Nodes =
       (Node *)0x0;
  (dst->userinfo).super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
  LastFree = (Node *)0x0;
  (dst->userinfo).super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
  Size = 0;
  (dst->userinfo).super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
  NumUsed = 0;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::SetNodeVector
            (&this->super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,1
            );
  local_68._16_8_ = local_68._16_8_ & 0xffffffff;
  M_Free(local_68.Nodes);
  local_68.Nodes =
       (src->userinfo).
       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Nodes;
  local_68.LastFree =
       (src->userinfo).
       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.LastFree;
  local_68.Size =
       (src->userinfo).
       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size;
  local_68.NumUsed =
       (src->userinfo).
       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.NumUsed;
  (src->userinfo).super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
  Nodes = (Node *)0x0;
  (src->userinfo).super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
  LastFree = (Node *)0x0;
  (src->userinfo).super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
  Size = 0;
  (src->userinfo).super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
  NumUsed = 0;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::SetNodeVector
            (&(src->userinfo).
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,1);
  uVar3 = dst->cheats;
  bVar1 = dst->attackdown;
  bVar2 = dst->usedown;
  player_t::operator=(dst,src);
  dst->cheats = dst->cheats | uVar3 & 0x20;
  pDVar4 = (dst->Bot).field_0.p;
  if (pDVar4 != (DBot *)0x0) {
    if (((pDVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pbVar11 = (botinfo_t *)&bglobal.botinfo;
      do {
        pbVar11 = pbVar11->next;
        if (pbVar11 == (botinfo_t *)0x0) goto LAB_0043fa40;
        iVar7 = strcasecmp(name,pbVar11->name);
      } while (iVar7 != 0);
      pbVar11->inuse = 2;
LAB_0043fa40:
      bglobal.botnum = bglobal.botnum + 1;
      TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
                (&this->
                  super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,
                 &local_68);
      goto LAB_0043fa71;
    }
    (dst->Bot).field_0.p = (DBot *)0x0;
  }
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
            (&this->super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,
             &local_48);
LAB_0043fa71:
  puVar6 = (undefined8 *)
           ((long)&((dst->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Nodes)->Next +
           (ulong)(((dst->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                    Size - 1 & 0x208) * 0x18));
  do {
    puVar8 = puVar6;
    puVar6 = (undefined8 *)*puVar8;
  } while (*(int *)(puVar8 + 1) != 0x208);
  iVar7 = R_FindSkin(skins[*(int *)(puVar8[2] + 0x28)].name,(uint)dst->CurrentPlayerClass);
  userinfo_t::SkinNumChanged(this,iVar7);
  if (dst->mo != (APlayerPawn *)0x0) {
    (dst->mo->super_AActor).player = dst;
  }
  pDVar5 = (dst->psprites).field_0.p;
  if (pDVar5 != (DPSprite *)0x0) {
    if (((pDVar5->super_DObject).ObjectFlags & 0x20) == 0) {
      do {
        pDVar10 = pDVar5;
        pDVar10->Owner = dst;
        pDVar5 = (pDVar10->Next).field_0.p;
        if (pDVar5 == (DPSprite *)0x0) goto LAB_0043fb0f;
      } while (((pDVar5->super_DObject).ObjectFlags & 0x20) == 0);
      paVar9 = &(pDVar10->Next).field_0;
    }
    else {
      paVar9 = &(dst->psprites).field_0;
    }
    *paVar9 = (anon_union_8_2_947301c2_for_TObjPtr<DPSprite>_1)0x0;
  }
LAB_0043fb0f:
  (src->psprites).field_0.p = (DPSprite *)0x0;
  dst->attackdown = bVar1;
  dst->usedown = bVar2;
  userinfo_t::~userinfo_t((userinfo_t *)&local_68);
  userinfo_t::~userinfo_t((userinfo_t *)&local_48);
  return;
}

Assistant:

void CopyPlayer(player_t *dst, player_t *src, const char *name)
{
	// The userinfo needs to be saved for real players, but it
	// needs to come from the save for bots.
	userinfo_t uibackup;
	userinfo_t uibackup2;

	uibackup.TransferFrom(dst->userinfo);
	uibackup2.TransferFrom(src->userinfo);

	int chasecam = dst->cheats & CF_CHASECAM;	// Remember the chasecam setting
	bool attackdown = dst->attackdown;
	bool usedown = dst->usedown;


	*dst = *src;		// To avoid memory leaks at this point the userinfo in src must be empty which is taken care of by the TransferFrom call above.

	dst->cheats |= chasecam;

	if (dst->Bot != nullptr)
	{
		botinfo_t *thebot = bglobal.botinfo;
		while (thebot && stricmp(name, thebot->name))
		{
			thebot = thebot->next;
		}
		if (thebot)
		{
			thebot->inuse = BOTINUSE_Yes;
		}
		bglobal.botnum++;
		dst->userinfo.TransferFrom(uibackup2);
	}
	else
	{
		dst->userinfo.TransferFrom(uibackup);
	}
	// Validate the skin
	dst->userinfo.SkinNumChanged(R_FindSkin(skins[dst->userinfo.GetSkin()].name, dst->CurrentPlayerClass));

	// Make sure the player pawn points to the proper player struct.
	if (dst->mo != nullptr)
	{
		dst->mo->player = dst;
	}

	// Same for the psprites.
	DPSprite *pspr = dst->psprites;
	while (pspr)
	{
		pspr->Owner = dst;

		pspr = pspr->Next;
	}

	// Don't let the psprites be destroyed when src is destroyed.
	src->psprites = nullptr;

	// These 2 variables may not be overwritten.
	dst->attackdown = attackdown;
	dst->usedown = usedown;
}